

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osscurses.cc
# Opt level: O3

void ossdsp(int line,int column,int color,char *msg)

{
  if (((uint)color >> 0x17 & 1) == 0) {
    (*globalApp->_vptr_FrobTadsApplication[3])(globalApp,line,column,color,msg);
    return;
  }
  return;
}

Assistant:

void
ossdsp( int line, int column, int color, const char* msg )
{
    // Suppress output if the text should be invisible.  This is the
    // only way to have "invisible" text without color-support.
    // When colors are enabled, text and background will have the
    // same color, so the text is really invisible in color-mode;
    // A_INVIS is not needed then.
    if (not (color & A_INVIS)) globalApp->print(line, column, color, msg);
}